

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmLinkImplementationLibraries *pcVar6;
  string *in_relative;
  pointer this_00;
  string libDir;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  cmListFileBacktrace local_148;
  ulong local_130;
  string local_128;
  string local_108;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
  uniqueIncludes._M_h._M_bucket_count = 1;
  uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueIncludes._M_h._M_element_count = 0;
  uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"INCLUDE_DIRECTORIES",(allocator<char> *)&libDir);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_108,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_108);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libDir,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&local_128);
  __s = cmMakefile::GetDefinition(pcVar1,&libDir);
  std::__cxx11::string::~string((string *)&libDir);
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&libDir,__s,(allocator<char> *)&local_128);
    cmSystemTools::ExpandListArgument(&libDir,&debugProperties,false);
    std::__cxx11::string::~string((string *)&libDir);
  }
  if (this->DebugIncludesDone == false) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    bVar3 = _Var5._M_current !=
            debugProperties.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar3 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  local_130 = (ulong)bVar3;
  processIncludeDirectories
            (this,&this->IncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,bVar3,lang);
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libDir,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&local_128);
  AddInterfaceEntries(this,config,&libDir,&linkInterfaceIncludeDirectoriesEntries);
  std::__cxx11::string::~string((string *)&libDir);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libDir,"APPLE",(allocator<char> *)&local_128);
  bVar3 = cmMakefile::IsOn(pcVar1,&libDir);
  std::__cxx11::string::~string((string *)&libDir);
  if (bVar3) {
    pcVar6 = GetLinkImplementationLibraries(this,config);
    pcVar2 = (pcVar6->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pcVar6->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pcVar2; this_00 = this_00 + 1) {
      in_relative = cmLinkItem::AsStr_abi_cxx11_(&this_00->super_cmLinkItem);
      cmsys::SystemTools::CollapseFullPath(&libDir,in_relative);
      if (GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
          frameworkCheck == '\0') {
        iVar4 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                     ::frameworkCheck);
        if (iVar4 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
      }
      bVar3 = cmsys::RegularExpression::find
                        (&GetIncludeDirectories::frameworkCheck,libDir._M_dataplus._M_p);
      if (bVar3) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_128,&GetIncludeDirectories::frameworkCheck.regmatch,1);
        std::__cxx11::string::operator=((string *)&libDir,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        local_148.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_148.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128._M_dataplus._M_p = (pointer)CreateTargetPropertyEntry(&libDir,&local_148,false);
        std::
        vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
        ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
                  ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                    *)&linkInterfaceIncludeDirectoriesEntries,(TargetPropertyEntry **)&local_128);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_148.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      std::__cxx11::string::~string((string *)&libDir);
    }
  }
  processIncludeDirectories
            (this,&linkInterfaceIncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,SUB81(local_130,0),lang);
  cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
            (&linkInterfaceIncludeDirectoriesEntries);
  std::
  _Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::~_Vector_base(&linkInterfaceIncludeDirectoriesEntries.
                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueIncludes._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  const char* debugProp =
    this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugIncludes = !this->DebugIncludesDone &&
    std::find(debugProperties.begin(), debugProperties.end(),
              "INCLUDE_DIRECTORIES") != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  processIncludeDirectories(this, this->IncludeDirectoriesEntries, includes,
                            uniqueIncludes, &dagChecker, config, debugIncludes,
                            lang);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES",
                      linkInterfaceIncludeDirectoriesEntries);

  if (this->Makefile->IsOn("APPLE")) {
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibraries(config);
    for (cmLinkImplItem const& lib : impl->Libraries) {
      std::string libDir = cmSystemTools::CollapseFullPath(lib.AsStr());

      static cmsys::RegularExpression frameworkCheck(
        "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if (!frameworkCheck.find(libDir)) {
        continue;
      }

      libDir = frameworkCheck.match(1);

      linkInterfaceIncludeDirectoriesEntries.push_back(
        CreateTargetPropertyEntry(libDir));
    }
  }

  processIncludeDirectories(this, linkInterfaceIncludeDirectoriesEntries,
                            includes, uniqueIncludes, &dagChecker, config,
                            debugIncludes, lang);

  cmDeleteAll(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}